

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin2.c
# Opt level: O2

int Gia_ManGetTwo(Gia_Man_t *p,int iFrame,Gia_Obj_t *pObj)

{
  int iVar1;
  Vec_Int_t *p_00;
  int iVar2;
  int *piVar3;
  
  p_00 = p->vTruths;
  iVar1 = p->nTtWords;
  iVar2 = Gia_ObjId(p,pObj);
  piVar3 = Vec_IntEntryP(p_00,iFrame * iVar1);
  return (uint)piVar3[iVar2 >> 4] >> ((char)iVar2 * '\x02' & 0x1fU) & 3;
}

Assistant:

static inline int  Gia_ManGetTwo( Gia_Man_t * p, int iFrame, Gia_Obj_t * pObj )              { return Abc_InfoGet2Bits( p->vTruths, p->nTtWords, iFrame, Gia_ObjId(p, pObj) ); }